

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp3length.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  adu_t *__ptr;
  ulong time;
  file_t mp3file;
  aq_t qin;
  char buf [256];
  mp3_frame_t frame;
  file_t fStack_5ff8;
  aq_t local_5fd0;
  char local_5f98 [264];
  mp3_frame_t local_5e90;
  
  if (argc == 2) {
    iVar1 = file_open_read(&fStack_5ff8,argv[1]);
    if (iVar1 != 0) {
      aq_init(&local_5fd0);
      iVar1 = mp3_next_frame(&fStack_5ff8,&local_5e90);
      time = 0;
      if (0 < iVar1) {
        do {
          iVar1 = aq_add_frame(&local_5fd0,&local_5e90);
          if (iVar1 != 0) {
            __ptr = aq_get_adu(&local_5fd0);
            if (__ptr == (adu_t *)0x0) {
              __assert_fail("adu != NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/mp3length.c"
                            ,0x2a,"int main(int, char **)");
            }
            time = time + __ptr->usec;
            free(__ptr);
          }
          iVar1 = mp3_next_frame(&fStack_5ff8,&local_5e90);
        } while (0 < iVar1);
        time = time / 1000;
      }
      file_close(&fStack_5ff8);
      aq_destroy(&local_5fd0);
      format_time(time,local_5f98,0x100);
      printf("Length of %s: %s\n",argv[1],local_5f98);
      return 0;
    }
    main_cold_2();
  }
  else {
    main_cold_1();
  }
  return 1;
}

Assistant:

int main(int argc, char *argv[]) {
  int retval = EXIT_SUCCESS;

  if (argc != 2) {
    usage();
    return EXIT_FAILURE;
  }

  file_t mp3file;
  if (!file_open_read(&mp3file, argv[1])) {
    fprintf(stderr, "Could not open mp3 file: %s\n", argv[1]);
    retval = EXIT_FAILURE;
    goto exit;
  }

  aq_t qin;
  aq_init(&qin);
  
  mp3_frame_t frame;
  int ret;
  unsigned long long time = 0;
  while ((ret = mp3_next_frame(&mp3file, &frame)) > 0) {
    if (aq_add_frame(&qin, &frame)) { 
      adu_t *adu = aq_get_adu(&qin);
      assert(adu != NULL);
      
      time += adu->usec;
      free(adu);
    }
  }
          
  file_close(&mp3file);
  aq_destroy(&qin);

  char buf[256];
  format_time(time / 1000, buf, sizeof(buf));
  printf("Length of %s: %s\n", argv[1], buf);

 exit:
  return retval;
}